

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_api_test.cc
# Opt level: O1

aom_image_t * anon_unknown.dwarf_15bbe11::CreateGrayImage(aom_img_fmt_t fmt,uint w,uint h)

{
  aom_image_t *paVar1;
  uint uVar2;
  uint uVar3;
  ulong __n;
  
  paVar1 = aom_img_alloc((aom_image_t *)0x0,AOM_IMG_FMT_I420,fmt,w,1);
  if (paVar1 != (aom_image_t *)0x0) {
    uVar2 = paVar1->d_h;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        memset(paVar1->planes[0] + paVar1->stride[0] * uVar3,0x80,(ulong)paVar1->d_w);
        uVar3 = uVar3 + 1;
        uVar2 = paVar1->d_h;
      } while (uVar3 < uVar2);
    }
    if (1 < uVar2 + 1) {
      __n = (ulong)(paVar1->d_w + 1 >> 1);
      uVar3 = 0;
      do {
        memset(paVar1->planes[1] + paVar1->stride[1] * uVar3,0x80,__n);
        memset(paVar1->planes[2] + paVar1->stride[2] * uVar3,0x80,__n);
        uVar3 = uVar3 + 1;
      } while (uVar2 + 1 >> 1 != uVar3);
    }
  }
  return paVar1;
}

Assistant:

aom_image_t *CreateGrayImage(aom_img_fmt_t fmt, unsigned int w,
                             unsigned int h) {
  aom_image_t *const image = aom_img_alloc(nullptr, fmt, w, h, 1);
  if (!image) return image;

  for (unsigned int i = 0; i < image->d_h; ++i) {
    memset(image->planes[0] + i * image->stride[0], 128, image->d_w);
  }
  const unsigned int uv_h = (image->d_h + 1) / 2;
  const unsigned int uv_w = (image->d_w + 1) / 2;
  for (unsigned int i = 0; i < uv_h; ++i) {
    memset(image->planes[1] + i * image->stride[1], 128, uv_w);
    memset(image->planes[2] + i * image->stride[2], 128, uv_w);
  }
  return image;
}